

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5SegIterReverseInitPage(Fts5Index *p,Fts5SegIter *pIter)

{
  u8 *puVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int *pOld;
  int iVar7;
  int iVar8;
  i64 iDelta;
  uint local_5c;
  long local_58;
  int local_4c;
  Fts5Index *local_48;
  u64 local_40;
  u8 *local_38;
  
  local_4c = p->pConfig->eDetail;
  iVar4 = pIter->pLeaf->szLeaf;
  iVar5 = pIter->iLeafOffset;
  iVar7 = pIter->iEndofDoclist;
  if (iVar4 < pIter->iEndofDoclist) {
    iVar7 = iVar4;
  }
  local_38 = pIter->pLeaf->p;
  local_58 = 0;
  local_48 = p;
  while( true ) {
    puVar1 = local_38;
    local_40 = 0;
    if (local_4c == 1) {
      iVar4 = iVar5;
      if ((iVar5 < iVar7) && (local_38[iVar5] == '\0')) {
        lVar6 = (long)iVar5 + 1;
        iVar3 = (int)lVar6;
        iVar4 = iVar3;
        if ((iVar3 < iVar7) && (iVar4 = iVar5 + 2, local_38[lVar6] != '\0')) {
          iVar4 = iVar3;
        }
      }
    }
    else {
      local_5c = (uint)local_38[iVar5];
      iVar4 = 1;
      if ((char)local_38[iVar5] < '\0') {
        iVar4 = sqlite3Fts5GetVarint32(local_38 + iVar5,&local_5c);
      }
      iVar4 = iVar4 + iVar5 + (int)local_5c / 2;
    }
    if (iVar7 <= iVar4) goto LAB_001cbe08;
    bVar2 = sqlite3Fts5GetVarint(puVar1 + iVar4,&local_40);
    pIter->iRowid = pIter->iRowid + local_40;
    iVar3 = pIter->nRowidOffset;
    pOld = pIter->aRowidOffset;
    iVar8 = iVar5;
    if (iVar3 <= local_58) break;
LAB_001cbdce:
    iVar5 = iVar4 + (uint)bVar2;
    pOld[local_58] = iVar8;
    local_58 = local_58 + 1;
    pIter->iLeafOffset = iVar5;
  }
  iVar5 = sqlite3_initialize();
  if (iVar5 == 0) {
    lVar6 = (long)iVar3 + 8;
    pOld = (int *)sqlite3Realloc(pOld,lVar6 * 4);
    if (pOld != (int *)0x0) {
      pIter->aRowidOffset = pOld;
      pIter->nRowidOffset = (int)lVar6;
      iVar8 = pIter->iLeafOffset;
      goto LAB_001cbdce;
    }
  }
  local_48->rc = 7;
LAB_001cbe08:
  pIter->iRowidOffset = (int)local_58;
  fts5SegIterLoadNPos(local_48,pIter);
  return;
}

Assistant:

static void fts5SegIterReverseInitPage(Fts5Index *p, Fts5SegIter *pIter){
  int eDetail = p->pConfig->eDetail;
  int n = pIter->pLeaf->szLeaf;
  int i = pIter->iLeafOffset;
  u8 *a = pIter->pLeaf->p;
  int iRowidOffset = 0;

  if( n>pIter->iEndofDoclist ){
    n = pIter->iEndofDoclist;
  }

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  while( 1 ){
    i64 iDelta = 0;

    if( eDetail==FTS5_DETAIL_NONE ){
      /* todo */
      if( i<n && a[i]==0 ){
        i++;
        if( i<n && a[i]==0 ) i++;
      }
    }else{
      int nPos;
      int bDummy;
      i += fts5GetPoslistSize(&a[i], &nPos, &bDummy);
      i += nPos;
    }
    if( i>=n ) break;
    i += fts5GetVarint(&a[i], (u64*)&iDelta);
    pIter->iRowid += iDelta;

    /* If necessary, grow the pIter->aRowidOffset[] array. */
    if( iRowidOffset>=pIter->nRowidOffset ){
      int nNew = pIter->nRowidOffset + 8;
      int *aNew = (int*)sqlite3_realloc64(pIter->aRowidOffset,nNew*sizeof(int));
      if( aNew==0 ){
        p->rc = SQLITE_NOMEM;
        break;
      }
      pIter->aRowidOffset = aNew;
      pIter->nRowidOffset = nNew;
    }

    pIter->aRowidOffset[iRowidOffset++] = pIter->iLeafOffset;
    pIter->iLeafOffset = i;
  }
  pIter->iRowidOffset = iRowidOffset;
  fts5SegIterLoadNPos(p, pIter);
}